

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

size_t __thiscall caffe::WindowDataParameter::ByteSizeLong(WindowDataParameter *this)

{
  void *pvVar1;
  size_type sVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  uint in_EDX;
  uint extraout_EDX;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  
  pvVar1 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    sVar4 = 0;
  }
  else {
    sVar4 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
    in_EDX = extraout_EDX;
  }
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar7 != '\0') {
    if ((uVar7 & 1) != 0) {
      sVar2 = ((this->source_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar7 & 2) != 0) {
      sVar2 = ((this->mean_file_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar7 & 4) != 0) {
      sVar2 = ((this->crop_mode_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar7 & 8) != 0) {
      sVar2 = ((this->root_folder_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar2 | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + sVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar7 & 0x10) != 0) {
      uVar6 = this->batch_size_ | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar7 & 0x20) != 0) {
      uVar6 = this->crop_size_ | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      sVar4 = sVar4 + (iVar3 * 9 + 0x49U >> 6) + 1;
    }
    in_EDX = uVar7 >> 5 & 2;
    sVar4 = sVar4 + ((uVar7 >> 6 & 2) + in_EDX);
  }
  if ((uVar7 & 0x1f00) != 0) {
    if ((uVar7 >> 8 & 1) != 0) {
      uVar6 = this->context_pad_ | 1;
      iVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      in_EDX = iVar3 * 9 + 0x49U >> 6;
      sVar4 = sVar4 + in_EDX + 1;
    }
    auVar8._0_4_ = -(uint)((uVar7 & 0x1000) == 0);
    auVar8._4_4_ = -(uint)((uVar7 & 0x800) == 0);
    auVar8._8_4_ = -(uint)((uVar7 & 0x400) == 0);
    auVar8._12_4_ = -(uint)((uVar7 & 0x200) == 0);
    uVar7 = movmskps(in_EDX,auVar8);
    sVar5 = sVar4 + 5;
    if ((uVar7 & 8) != 0) {
      sVar5 = sVar4;
    }
    sVar4 = sVar5 + 5;
    if ((uVar7 & 4) != 0) {
      sVar4 = sVar5;
    }
    sVar5 = sVar4 + 5;
    if ((uVar7 & 2) != 0) {
      sVar5 = sVar4;
    }
    sVar4 = sVar5 + 5;
    if ((uVar7 & 1) != 0) {
      sVar4 = sVar5;
    }
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t WindowDataParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.WindowDataParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string source = 1;
    if (has_source()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source());
    }

    // optional string mean_file = 3;
    if (has_mean_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->mean_file());
    }

    // optional string crop_mode = 11 [default = "warp"];
    if (has_crop_mode()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->crop_mode());
    }

    // optional string root_folder = 13 [default = ""];
    if (has_root_folder()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->root_folder());
    }

    // optional uint32 batch_size = 4;
    if (has_batch_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batch_size());
    }

    // optional uint32 crop_size = 5 [default = 0];
    if (has_crop_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->crop_size());
    }

    // optional bool mirror = 6 [default = false];
    if (has_mirror()) {
      total_size += 1 + 1;
    }

    // optional bool cache_images = 12 [default = false];
    if (has_cache_images()) {
      total_size += 1 + 1;
    }

  }
  if (_has_bits_[8 / 32] & 7936u) {
    // optional uint32 context_pad = 10 [default = 0];
    if (has_context_pad()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->context_pad());
    }

    // optional float scale = 2 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

    // optional float fg_threshold = 7 [default = 0.5];
    if (has_fg_threshold()) {
      total_size += 1 + 4;
    }

    // optional float bg_threshold = 8 [default = 0.5];
    if (has_bg_threshold()) {
      total_size += 1 + 4;
    }

    // optional float fg_fraction = 9 [default = 0.25];
    if (has_fg_fraction()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}